

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O3

int Abc_ExactDelayCost(word *pTruth,int nVars,int *pArrTimeProfile,char *pPerm,int *Cost,
                      int AigLevel)

{
  char cVar1;
  bool bVar2;
  unsigned_long *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Ses_Store_t *pSVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Ses_Man_t *pSes;
  char *pcVar11;
  ulong uVar12;
  long lVar13;
  undefined8 uVar14;
  FILE *pFVar15;
  long lVar16;
  char *pcVar17;
  ulong *puVar18;
  char *pSol;
  long lVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  long local_b0;
  char *local_a0;
  timespec ts_3;
  int pNormalArrTime [8];
  long local_48;
  int nMaxArrival;
  
  uVar20 = (ulong)(uint)nVars;
  local_a0 = (char *)0x0;
  iVar8 = clock_gettime(3,(timespec *)pNormalArrTime);
  pSVar7 = s_pSesStore;
  if (iVar8 < 0) {
    local_b0 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816((long)pNormalArrTime._8_8_),8);
    local_b0 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) +
               CONCAT44(pNormalArrTime[1],pNormalArrTime[0]) * -1000000;
  }
  if (8 < (uint)nVars) {
    printf("invalid truth table size %d\n",(ulong)(uint)nVars);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                  ,0xaa9,"int Abc_ExactDelayCost(word *, int, int *, char *, int *, int)");
  }
  s_pSesStore->nCutCount = s_pSesStore->nCutCount + 1;
  pSVar7->pCutCount[uVar20] = pSVar7->pCutCount[uVar20] + 1;
  if (nVars == 1) {
    pSVar7->nSynthesizedTrivial = pSVar7->nSynthesizedTrivial + 1;
    pSVar7->pSynthesizedTrivial[1] = pSVar7->pSynthesizedTrivial[1] + 1;
    *Cost = 0;
    *pPerm = '\0';
    iVar8 = clock_gettime(3,(timespec *)pNormalArrTime);
    if (iVar8 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = (long)pNormalArrTime._8_8_ / 1000 +
               CONCAT44(pNormalArrTime[1],pNormalArrTime[0]) * 1000000;
    }
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar13 + local_b0;
    iVar8 = *pArrTimeProfile;
  }
  else if (nVars == 0) {
    auVar22._8_4_ = 0xffffffff;
    auVar22._0_8_ = 0xffffffffffffffff;
    auVar22._12_4_ = 0xffffffff;
    pSVar7->nSynthesizedTrivial = pSVar7->nSynthesizedTrivial + 1;
    pSVar7->pSynthesizedTrivial[0] = pSVar7->pSynthesizedTrivial[0] - auVar22._8_8_;
    *Cost = 0;
    iVar8 = clock_gettime(3,(timespec *)pNormalArrTime);
    if (iVar8 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = (long)pNormalArrTime._8_8_ / 1000 +
               CONCAT44(pNormalArrTime[1],pNormalArrTime[0]) * 1000000;
    }
    s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar13 + local_b0;
    iVar8 = 0;
  }
  else {
    memcpy(pNormalArrTime,pArrTimeProfile,uVar20 * 4);
    iVar8 = Abc_NormalizeArrivalTimes(pNormalArrTime,nVars,&nMaxArrival);
    *Cost = 1000000000;
    iVar9 = Ses_StoreGetEntry(pSVar7,pTruth,nVars,pNormalArrTime,&local_a0);
    pSVar7 = s_pSesStore;
    if (iVar9 == 0) {
      cVar1 = (char)nVars;
      if (s_pSesStore->fVeryVerbose != 0) {
        printf("\x1b[36m");
        pFVar15 = _stdout;
        uVar10 = 1 << (cVar1 - 6U & 0x1f);
        if ((uint)nVars < 7) {
          uVar10 = 1;
        }
        puVar18 = pTruth + ((ulong)uVar10 - 1);
        if (pTruth <= puVar18) {
          uVar12 = 0xf;
          if ((uint)nVars < 6) {
            uVar12 = (ulong)(uint)~(-1 << (cVar1 - 2U & 0x1f));
          }
          lVar13 = uVar12 + 1;
          lVar19 = uVar12 << 2;
          do {
            uVar10 = (uint)(*puVar18 >> ((byte)lVar19 & 0x3c)) & 0xf;
            iVar8 = uVar10 + 0x30;
            if (9 < uVar10) {
              iVar8 = uVar10 + 0x37;
            }
            fputc(iVar8,pFVar15);
            lVar16 = lVar13 + -1;
            bVar2 = 0 < lVar13;
            lVar13 = lVar16;
            lVar19 = lVar19 + -4;
          } while ((lVar16 != 0 && bVar2) ||
                  (puVar18 = puVar18 + -1, lVar13 = uVar12 + 1, lVar19 = uVar12 << 2,
                  pTruth <= puVar18));
        }
        printf("\x1b[0m");
        printf(" [%d",(ulong)(uint)pNormalArrTime[0]);
        uVar12 = 1;
        do {
          printf(" %d",(ulong)(uint)pNormalArrTime[uVar12]);
          uVar12 = uVar12 + 1;
        } while (uVar20 != uVar12);
        printf("]@%d:",AigLevel);
        fflush(_stdout);
      }
      uVar12 = 1;
      do {
        iVar9 = pNormalArrTime[uVar12];
        if (pNormalArrTime[uVar12] < pNormalArrTime[0]) {
          iVar9 = pNormalArrTime[0];
        }
        uVar12 = uVar12 + 1;
        pNormalArrTime[0] = iVar9;
      } while (uVar20 != uVar12);
      iVar9 = nVars + iVar9 + 1;
      if (AigLevel != -1) {
        iVar9 = nVars + 1 + iVar9;
        if (AigLevel - iVar8 < iVar9) {
          iVar9 = AigLevel - iVar8;
        }
      }
      iVar8 = clock_gettime(3,(timespec *)&ts_3);
      if (iVar8 < 0) {
        local_48 = 1;
      }
      else {
        lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts_3.tv_nsec),8);
        local_48 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + ts_3.tv_sec * -1000000;
      }
      pSes = Ses_ManAlloc(pTruth,nVars,1,iVar9,pNormalArrTime,s_pSesStore->fMakeAIG,
                          s_pSesStore->nBTLimit,s_pSesStore->fVerbose);
      pSVar7 = s_pSesStore;
      pSes->fVeryVerbose = s_pSesStore->fVeryVerbose;
      pSes->pSat = pSVar7->pSat;
      pSes->nStartGates = nVars + -2;
      iVar8 = pSes->nMaxDepth;
      pSol = local_a0;
      while (pcVar17 = pSol, iVar8 != 0) {
        if (s_pSesStore->fVeryVerbose != 0) {
          printf(" %d");
          fflush(_stdout);
        }
        pcVar11 = Ses_ManFindMinimumSize(pSes);
        if (pcVar11 == (char *)0x0) {
          if (s_pSesStore->fVeryVerbose != 0) {
            uVar10 = pSes->nMaxDepth;
            local_a0 = pSol;
            if (9 < (int)uVar10) {
              putchar(8);
              uVar10 = pSes->nMaxDepth;
            }
            pcVar17 = "\x1b[31m";
            if (pSes->fHitResLimit == 0) {
              pcVar17 = "\x1b[33m";
            }
            printf("\b%s%d\x1b[0m",pcVar17,(ulong)uVar10);
            pcVar17 = local_a0;
          }
          break;
        }
        if (s_pSesStore->fVeryVerbose != 0) {
          uVar10 = pSes->nMaxDepth;
          if (9 < (int)uVar10) {
            putchar(8);
            uVar10 = pSes->nMaxDepth;
          }
          printf("\b\x1b[32m%d\x1b[0m",(ulong)uVar10);
        }
        if (pSol != (char *)0x0) {
          free(pSol);
        }
        iVar8 = pSes->nMaxDepth + -1;
        pSes->nMaxDepth = iVar8;
        pSol = pcVar11;
      }
      local_a0 = pcVar17;
      if (s_pSesStore->fVeryVerbose != 0) {
        puts("        ");
      }
      pSVar7 = s_pSesStore;
      if (((FILE *)s_pSesStore->pDebugEntries != (FILE *)0x0) && (pSes->fHitResLimit != 0)) {
        uVar10 = pSes->nMaxDepth;
        fprintf((FILE *)s_pSesStore->pDebugEntries,"abc -c \"exact -v -C %d",
                (ulong)(uint)s_pSesStore->nBTLimit);
        if (s_pSesStore->fMakeAIG != 0) {
          fwrite(" -a",3,1,(FILE *)pSVar7->pDebugEntries);
        }
        fprintf((FILE *)pSVar7->pDebugEntries," -S %d -D %d -A",(ulong)(nVars - 1),(ulong)uVar10);
        uVar12 = 0;
        do {
          uVar14 = 0x2c;
          if (uVar12 == 0) {
            uVar14 = 0x20;
          }
          fprintf((FILE *)pSVar7->pDebugEntries,"%c%d",uVar14,(ulong)(uint)pNormalArrTime[uVar12]);
          uVar12 = uVar12 + 1;
        } while (uVar20 != uVar12);
        fputc(0x20,(FILE *)pSVar7->pDebugEntries);
        iVar8 = 1 << (cVar1 - 6U & 0x1f);
        if ((uint)nVars < 7) {
          iVar8 = 1;
        }
        pFVar15 = (FILE *)pSVar7->pDebugEntries;
        puVar18 = pTruth + (long)iVar8 + -1;
        if (pTruth <= puVar18) {
          uVar12 = 0xf;
          if (nVars < 6) {
            uVar12 = (ulong)(uint)~(-1 << ((byte)(nVars + -2) & 0x1f));
          }
          lVar13 = uVar12 + 1;
          lVar19 = uVar12 << 2;
          do {
            uVar10 = (uint)(*puVar18 >> ((byte)lVar19 & 0x3c)) & 0xf;
            iVar8 = uVar10 + 0x30;
            if (9 < uVar10) {
              iVar8 = uVar10 + 0x37;
            }
            fputc(iVar8,pFVar15);
            lVar16 = lVar13 + -1;
            bVar2 = 0 < lVar13;
            lVar13 = lVar16;
            lVar19 = lVar19 + -4;
          } while ((lVar16 != 0 && bVar2) ||
                  (puVar18 = puVar18 + -1, lVar13 = uVar12 + 1, lVar19 = uVar12 << 2,
                  pTruth <= puVar18));
          pFVar15 = (FILE *)pSVar7->pDebugEntries;
        }
        fwrite("\" # ",4,1,pFVar15);
        if (pSol == (char *)0x0) {
          fwrite("no ",3,1,(FILE *)pSVar7->pDebugEntries);
        }
        fwrite("solution found before\n",0x16,1,(FILE *)pSVar7->pDebugEntries);
      }
      iVar8 = clock_gettime(3,(timespec *)&ts_3);
      if (iVar8 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = ts_3.tv_nsec / 1000 + ts_3.tv_sec * 1000000;
      }
      pSes->timeTotal = lVar13 + local_48;
      pSVar7 = s_pSesStore;
      lVar19._0_4_ = pSes->nSatCalls;
      lVar19._4_4_ = pSes->nUnsatCalls;
      auVar21._8_4_ = lVar19._4_4_;
      auVar21._0_8_ = lVar19;
      auVar21._12_4_ = -(uint)(lVar19 < 0);
      puVar3 = &s_pSesStore->nUnsatCalls;
      lVar16 = s_pSesStore->timeSat;
      lVar4 = s_pSesStore->timeSatSat;
      lVar5 = s_pSesStore->timeSatUnsat;
      lVar6 = s_pSesStore->timeSatUndef;
      s_pSesStore->nSatCalls =
           s_pSesStore->nSatCalls +
           CONCAT44(-(uint)((int)(undefined4)lVar19 < 0),(undefined4)lVar19);
      pSVar7->nUnsatCalls = *puVar3 + auVar21._8_8_;
      pSVar7->nUndefCalls = pSVar7->nUndefCalls + (long)pSes->nUndefCalls;
      lVar19 = pSes->timeSatSat;
      pSVar7->timeSat = pSes->timeSat + lVar16;
      pSVar7->timeSatSat = lVar19 + lVar4;
      lVar19 = pSes->timeSatUndef;
      pSVar7->timeSatUnsat = pSes->timeSatUnsat + lVar5;
      pSVar7->timeSatUndef = lVar19 + lVar6;
      pSVar7->timeInstance = pSVar7->timeInstance + pSes->timeInstance;
      pSVar7->timeExact = pSVar7->timeExact + lVar13 + local_48;
      iVar8 = pSes->fHitResLimit;
      Ses_ManCleanLight(pSes);
      Ses_StoreAddEntry(s_pSesStore,pTruth,nVars,pNormalArrTime,pSol,iVar8);
    }
    else {
      s_pSesStore->nCacheHits = s_pSesStore->nCacheHits + 1;
      pSVar7->pCacheHits[uVar20] = pSVar7->pCacheHits[uVar20] + 1;
      pSol = local_a0;
    }
    if (pSol == (char *)0x0) {
      if (*Cost != 1000000000) {
        __assert_fail("*Cost == ABC_INFINITY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcExact.c"
                      ,0xb46,"int Abc_ExactDelayCost(word *, int, int *, char *, int *, int)");
      }
      iVar8 = clock_gettime(3,(timespec *)&ts_3);
      if (iVar8 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = ts_3.tv_nsec / 1000 + ts_3.tv_sec * 1000000;
      }
      s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar13 + local_b0;
      iVar8 = 1000000000;
    }
    else {
      *Cost = (int)pSol[2];
      cVar1 = pSol[2];
      uVar12 = 0;
      do {
        pPerm[uVar12] = pSol[uVar12 + (long)((int)cVar1 << 2) + 5];
        uVar12 = uVar12 + 1;
      } while (uVar20 != uVar12);
      uVar12 = 0;
      iVar9 = 0;
      do {
        iVar8 = (int)pPerm[uVar12] + pArrTimeProfile[uVar12];
        if ((int)pPerm[uVar12] + pArrTimeProfile[uVar12] < iVar9) {
          iVar8 = iVar9;
        }
        uVar12 = uVar12 + 1;
        iVar9 = iVar8;
      } while (uVar20 != uVar12);
      iVar9 = clock_gettime(3,(timespec *)&ts_3);
      if (iVar9 < 0) {
        lVar13 = -1;
      }
      else {
        lVar13 = ts_3.tv_nsec / 1000 + ts_3.tv_sec * 1000000;
      }
      s_pSesStore->timeTotal = s_pSesStore->timeTotal + lVar13 + local_b0;
    }
  }
  return iVar8;
}

Assistant:

int Abc_ExactDelayCost( word * pTruth, int nVars, int * pArrTimeProfile, char * pPerm, int * Cost, int AigLevel )
{
    int i, nMaxArrival, nDelta, l;
    Ses_Man_t * pSes = NULL;
    char * pSol = NULL, * pSol2 = NULL, * p;
    int pNormalArrTime[8];
    int Delay = ABC_INFINITY, nMaxDepth, fResLimit;
    abctime timeStart = Abc_Clock(), timeStartExact;

    /* some checks */
    if ( nVars < 0 || nVars > 8 )
    {
        printf( "invalid truth table size %d\n", nVars );
        assert( 0 );
    }

    /* statistics */
    s_pSesStore->nCutCount++;
    s_pSesStore->pCutCount[nVars]++;

    if ( nVars == 0 )
    {
        s_pSesStore->nSynthesizedTrivial++;
        s_pSesStore->pSynthesizedTrivial[0]++;

        *Cost = 0;
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return 0;
    }

    if ( nVars == 1 )
    {
        s_pSesStore->nSynthesizedTrivial++;
        s_pSesStore->pSynthesizedTrivial[1]++;

        *Cost = 0;
        pPerm[0] = (char)0;
        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return pArrTimeProfile[0];
    }

    for ( l = 0; l < nVars; ++l )
        pNormalArrTime[l] = pArrTimeProfile[l];

    nDelta = Abc_NormalizeArrivalTimes( pNormalArrTime, nVars, &nMaxArrival );

    *Cost = ABC_INFINITY;

    if ( Ses_StoreGetEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, &pSol ) )
    {
        s_pSesStore->nCacheHits++;
        s_pSesStore->pCacheHits[nVars]++;
    }
    else
    {
        if ( s_pSesStore->fVeryVerbose )
        {
            printf( ANSI_COLOR_CYAN );
            Abc_TtPrintHexRev( stdout, pTruth, nVars );
            printf( ANSI_COLOR_RESET );
            printf( " [%d", pNormalArrTime[0] );
            for ( l = 1; l < nVars; ++l )
                printf( " %d", pNormalArrTime[l] );
            printf( "]@%d:", AigLevel );
            fflush( stdout );
        }

        nMaxDepth = pNormalArrTime[0];
        for ( i = 1; i < nVars; ++i )
            nMaxDepth = Abc_MaxInt( nMaxDepth, pNormalArrTime[i] );
        nMaxDepth += nVars + 1;
        if ( AigLevel != -1 )
            nMaxDepth = Abc_MinInt( AigLevel - nDelta, nMaxDepth + nVars + 1 );

        timeStartExact = Abc_Clock();

        pSes = Ses_ManAlloc( pTruth, nVars, 1 /* nSpecFunc */, nMaxDepth, pNormalArrTime, s_pSesStore->fMakeAIG, s_pSesStore->nBTLimit, s_pSesStore->fVerbose );
        pSes->fVeryVerbose = s_pSesStore->fVeryVerbose;
        pSes->pSat = s_pSesStore->pSat;
        pSes->nStartGates = nVars - 2;

        while ( pSes->nMaxDepth ) /* there is improvement */
        {
            if ( s_pSesStore->fVeryVerbose )
            {
                printf( " %d", pSes->nMaxDepth );
                fflush( stdout );
            }

            if ( ( pSol2 = Ses_ManFindMinimumSize( pSes ) ) != NULL )
            {
                if ( s_pSesStore->fVeryVerbose )
                {
                    if ( pSes->nMaxDepth >= 10 ) printf( "\b" );
                    printf( "\b" ANSI_COLOR_GREEN "%d" ANSI_COLOR_RESET, pSes->nMaxDepth );
                }
                if ( pSol )
                    ABC_FREE( pSol );
                pSol = pSol2;
                pSes->nMaxDepth--;
            }
            else
            {
                if ( s_pSesStore->fVeryVerbose )
                {
                    if ( pSes->nMaxDepth >= 10 ) printf( "\b" );
                    printf( "\b%s%d" ANSI_COLOR_RESET, pSes->fHitResLimit ? ANSI_COLOR_RED : ANSI_COLOR_YELLOW, pSes->nMaxDepth );
                }
                break;
            }
        }

        if ( s_pSesStore->fVeryVerbose )
            printf( "        \n" );

        /* log unsuccessful case for debugging */
        if ( s_pSesStore->pDebugEntries && pSes->fHitResLimit )
            Ses_StorePrintDebugEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, pSes->nMaxDepth, pSol, nVars - 2 );

        pSes->timeTotal = Abc_Clock() - timeStartExact;

        /* statistics */
        s_pSesStore->nSatCalls += pSes->nSatCalls;
        s_pSesStore->nUnsatCalls += pSes->nUnsatCalls;
        s_pSesStore->nUndefCalls += pSes->nUndefCalls;

        s_pSesStore->timeSat += pSes->timeSat;
        s_pSesStore->timeSatSat += pSes->timeSatSat;
        s_pSesStore->timeSatUnsat += pSes->timeSatUnsat;
        s_pSesStore->timeSatUndef += pSes->timeSatUndef;
        s_pSesStore->timeInstance += pSes->timeInstance;
        s_pSesStore->timeExact += pSes->timeTotal;

        /* cleanup (we need to clean before adding since pTruth may have been modified by pSes) */
        fResLimit = pSes->fHitResLimit;
        Ses_ManCleanLight( pSes );

        /* store solution */
        Ses_StoreAddEntry( s_pSesStore, pTruth, nVars, pNormalArrTime, pSol, fResLimit );
    }

    if ( pSol )
    {
        *Cost = pSol[ABC_EXACT_SOL_NGATES];
        p = pSol + 3 + 4 * pSol[ABC_EXACT_SOL_NGATES] + 1;
        Delay = *p++;
        for ( l = 0; l < nVars; ++l )
            pPerm[l] = *p++;
    }

    if ( pSol )
    {
        int Delay2 = 0;
        for ( l = 0; l < nVars; ++l )
        {
            //printf( "%d ", pPerm[l] );
            Delay2 = Abc_MaxInt( Delay2, pArrTimeProfile[l] + pPerm[l] );
        }
        //printf( "  output arrival = %d    recomputed = %d\n", Delay, Delay2 );
        //if ( Delay != Delay2 )
        //{
        //    printf( "^--- BUG!\n" );
        //    assert( 0 );
        //}

        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return Delay2;
    }
    else
    {
        assert( *Cost == ABC_INFINITY );

        s_pSesStore->timeTotal += ( Abc_Clock() - timeStart );
        return ABC_INFINITY;
    }
}